

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O0

int Gia_ManSimulateWords(Gia_Man_t *p,int nWords)

{
  int iVar1;
  Vec_Wrd_t *pVVar2;
  bool bVar3;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  int nWords_local;
  Gia_Man_t *p_local;
  
  Vec_WrdFreeP(&p->vSims);
  iVar1 = Gia_ManObjNum(p);
  pVVar2 = Vec_WrdStart(iVar1 * nWords);
  p->vSims = pVVar2;
  p->nSimWords = nWords;
  local_24 = 1;
  while( true ) {
    bVar3 = false;
    if (local_24 < p->nObjs) {
      pGStack_20 = Gia_ManObj(p,local_24);
      bVar3 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsAnd(pGStack_20);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCi(pGStack_20);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCo(pGStack_20);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                        ,0x6c,"int Gia_ManSimulateWords(Gia_Man_t *, int)");
        }
        Gia_ManObjSimPo(p,local_24);
      }
      else {
        Gia_ManObjSimPi(p,local_24);
      }
    }
    else {
      Gia_ManObjSimAnd(p,local_24);
    }
    local_24 = local_24 + 1;
  }
  return 1;
}

Assistant:

int Gia_ManSimulateWords( Gia_Man_t * p, int nWords )
{
    Gia_Obj_t * pObj; int i;
    // allocate simulation info for one timeframe
    Vec_WrdFreeP( &p->vSims );
    p->vSims = Vec_WrdStart( Gia_ManObjNum(p) * nWords );
    p->nSimWords = nWords;
    // perform simulation
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Gia_ManObjSimAnd( p, i );
        else if ( Gia_ObjIsCi(pObj) )
            Gia_ManObjSimPi( p, i );
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ManObjSimPo( p, i );
        else assert( 0 );
    }
    return 1;
}